

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQClosure::Mark(SQClosure *this,SQCollectable **chain)

{
  ulong uVar1;
  SQClass *pSVar2;
  SQFunctionProto *pSVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    pSVar2 = this->_base;
    if (pSVar2 != (SQClass *)0x0) {
      (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])(pSVar2,chain);
    }
    pSVar3 = this->_function;
    (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])(pSVar3,chain);
    if (0 < pSVar3->_noutervalues) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar4),
                   (SQCollectable_conflict **)chain);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < pSVar3->_noutervalues);
    }
    if (0 < pSVar3->_ndefaultparams) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(this->_defaultparams->super_SQObject)._type + lVar4),
                   (SQCollectable_conflict **)chain);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar5 < pSVar3->_ndefaultparams);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_base) _base->Mark(chain);
        SQFunctionProto *fp = _function;
        fp->Mark(chain);
        for(SQInteger i = 0; i < fp->_noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
        for(SQInteger k = 0; k < fp->_ndefaultparams; k++) SQSharedState::MarkObject(_defaultparams[k], chain);
    END_MARK()
}